

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-command.c
# Opt level: O0

void html_screenshot(char *path,wchar_t mode,term *other_term)

{
  term *t;
  wchar_t wVar1;
  int iVar2;
  char *fmt;
  char *s;
  ang_file *f;
  wchar_t local_a0;
  wchar_t local_9c;
  wchar_t local_98;
  wchar_t nc;
  ang_file *fp;
  char *mbbuf;
  char *close_color_str;
  char *change_color_fmt;
  char *new_color_fmt;
  term *main_term;
  wchar_t c;
  wchar_t bg_colour;
  wchar_t fg_colour;
  wchar_t oa;
  wchar_t a;
  wchar_t other_xst;
  wchar_t main_xst;
  wchar_t hgt;
  wchar_t wid;
  wchar_t other_hgt;
  wchar_t other_wid;
  wchar_t main_hgt;
  wchar_t main_wid;
  wchar_t x;
  wchar_t y;
  _Bool other_left;
  term *other_term_local;
  char *pcStack_10;
  wchar_t mode_local;
  char *path_local;
  
  t = Term;
  x._3_1_ = 0;
  fg_colour = L'\x01';
  bg_colour = L'\x01';
  c = L'\x01';
  main_term._4_4_ = L'\0';
  main_term._0_4_ = L' ';
  fmt = "[/COLOR][COLOR=\"#%02X%02X%02X\"]";
  if (mode == L'\0') {
    fmt = "</font><font color=\"#%02X%02X%02X\" style=\"background-color: #%02X%02X%02X\">";
  }
  _y = other_term;
  other_term_local._4_4_ = mode;
  pcStack_10 = path;
  wVar1 = text_wcsz();
  s = (char *)mem_alloc((long)(wVar1 + L'\x01'));
  f = file_open(pcStack_10,MODE_WRITE,FTYPE_TEXT);
  if (f == (ang_file *)0x0) {
    mem_free(s);
    plog_fmt("Cannot write the \'%s\' file!",pcStack_10);
  }
  else {
    Term_get_size(&other_wid,&other_hgt);
    if (_y == (term *)0x0) {
      wid = L'\0';
      hgt = L'\0';
    }
    else {
      Term_activate(_y);
      Term_get_size(&wid,&hgt);
      Term_activate(t);
    }
    if ((x._3_1_ & 1) == 0) {
      oa = other_wid + L'\x01';
      a = L'\0';
    }
    else {
      oa = L'\0';
      if (wid < L'\x01') {
        local_98 = L'\0';
      }
      else {
        local_98 = wid + L'\x01';
      }
      a = local_98;
    }
    if (other_hgt < hgt) {
      local_9c = hgt;
    }
    else {
      local_9c = other_hgt;
    }
    other_xst = local_9c;
    if (wid < L'\x01') {
      local_a0 = other_wid;
    }
    else {
      local_a0 = other_wid + wid + L'\x01';
    }
    main_xst = local_a0;
    if (other_term_local._4_4_ == L'\0') {
      file_putf(f,"<!DOCTYPE html><html><head>\n");
      file_putf(f,"  <meta http-equiv=\'Content-Type\' content=\'text/html; charset=utf-8\'>\n");
      file_putf(f,"  <meta name=\'generator\' content=\'%s\'>\n",buildid);
      file_putf(f,"  <title>%s</title>\n",pcStack_10);
      file_putf(f,"</head>\n\n");
      file_putf(f,"<body style=\'color: #%02X%02X%02X; background: #%02X%02X%02X;\'>\n",
                (ulong)angband_color_table[1][1],(ulong)angband_color_table[1][2],
                (ulong)angband_color_table[1][3],(ulong)angband_color_table[0][1],
                (uint)angband_color_table[0][2],(uint)angband_color_table[0][3]);
      file_putf(f,"<pre>\n");
    }
    else {
      file_putf(f,"[CODE][TT][BC=\"#%02X%02X%02X\"][COLOR=\"#%02X%02X%02X\"]\n",
                (ulong)angband_color_table[0][1],(ulong)angband_color_table[0][2],
                (ulong)angband_color_table[0][3],(ulong)angband_color_table[1][1],
                (uint)angband_color_table[1][2],(uint)angband_color_table[1][3]);
    }
    for (main_wid = L'\0'; main_wid < other_xst; main_wid = main_wid + L'\x01') {
      for (main_hgt = L'\0'; main_hgt < main_xst; main_hgt = main_hgt + L'\x01') {
        if (((main_hgt < a) || (a + other_wid <= main_hgt)) || (other_hgt <= main_wid)) {
          if (((main_hgt < oa) || (oa + wid <= main_hgt)) || (hgt <= main_wid)) {
            fg_colour = L'\x01';
            main_term._0_4_ = L' ';
          }
          else {
            if (main_hgt == oa) {
              Term_activate(_y);
            }
            Term_what(main_hgt - oa,main_wid,&fg_colour,(wchar_t *)&main_term);
            if (main_hgt == oa + wid + L'\xffffffff') {
              Term_activate(t);
            }
          }
        }
        else {
          screenshot_term_query
                    (main_xst,other_xst,main_hgt - a,main_wid,&fg_colour,(wchar_t *)&main_term);
        }
        c = fg_colour % 0x20;
        wVar1 = fg_colour;
        if (fg_colour < L'\0') {
          wVar1 = fg_colour + L'ÿ';
        }
        iVar2 = wVar1 >> 8;
        if (iVar2 == 0) {
          main_term._4_4_ = L'\0';
          wVar1 = main_term._4_4_;
        }
        else {
          wVar1 = c;
          if (iVar2 != 1) {
            if (iVar2 == 2) {
              main_term._4_4_ = L'\x1c';
              wVar1 = main_term._4_4_;
            }
            else if ((fg_colour < L'\0') || (wVar1 = main_term._4_4_, L'˿' < fg_colour)) {
              __assert_fail("(a >= 0) && (a < BG_MAX * MULT_BG)",
                            "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-command.c"
                            ,0x19d,"void html_screenshot(const char *, int, term *)");
            }
          }
        }
        main_term._4_4_ = wVar1;
        if ((bg_colour != fg_colour) &&
           ((other_term_local._4_4_ == L'\0' || ((wchar_t)main_term != L' ')))) {
          if ((bg_colour == L'\x01') && (other_term_local._4_4_ == L'\0')) {
            file_putf(f,"<font color=\"#%02X%02X%02X\" style=\"background-color: #%02X%02X%02X\">",
                      (ulong)angband_color_table[c][1],(ulong)angband_color_table[c][2],
                      (ulong)angband_color_table[c][3],
                      (ulong)angband_color_table[main_term._4_4_][1],
                      (uint)angband_color_table[main_term._4_4_][2],
                      (uint)angband_color_table[main_term._4_4_][3]);
          }
          else if (((c == L'\x01') && (main_term._4_4_ == L'\0')) &&
                  (other_term_local._4_4_ == L'\0')) {
            file_putf(f,"%s","</font>");
          }
          else {
            file_putf(f,fmt,(ulong)angband_color_table[c][1],(ulong)angband_color_table[c][2],
                      (ulong)angband_color_table[c][3],
                      (ulong)angband_color_table[main_term._4_4_][1],
                      (uint)angband_color_table[main_term._4_4_][2],
                      (uint)angband_color_table[main_term._4_4_][3]);
          }
          bg_colour = fg_colour;
        }
        if (other_term_local._4_4_ == L'\0') {
          write_html_escape_char(f,s,(wchar_t)main_term);
        }
        else {
          wVar1 = text_wctomb(s,(wchar_t)main_term);
          if (wVar1 < L'\x01') {
            *s = ' ';
            s[1] = '\0';
          }
          else {
            s[wVar1] = '\0';
          }
          file_putf(f,"%s",s);
        }
      }
      file_putf(f,"\n");
    }
    if ((bg_colour != L'\x01') && (other_term_local._4_4_ == L'\0')) {
      file_putf(f,"%s","</font>");
    }
    if (other_term_local._4_4_ == L'\0') {
      file_putf(f,"</pre>\n");
      file_putf(f,"</body>\n");
      file_putf(f,"</html>\n");
    }
    else {
      file_putf(f,"[/COLOR][/BC][/TT][/CODE]\n");
    }
    file_close(f);
    mem_free(s);
  }
  return;
}

Assistant:

void html_screenshot(const char *path, int mode, term *other_term)
{
	/* Put the contents of the other terminal on the right by default. */
	bool other_left = false;
	int y, x;
	int main_wid, main_hgt, other_wid, other_hgt, wid, hgt;
	int main_xst, other_xst;
	int a = COLOUR_WHITE;
	int oa = COLOUR_WHITE;
	int fg_colour = COLOUR_WHITE;
	int bg_colour = COLOUR_DARK;
	wchar_t c = L' ';
	term *main_term = Term;

	const char *new_color_fmt = "<font color=\"#%02X%02X%02X\" style=\"background-color: #%02X%02X%02X\">";
	const char *change_color_fmt = (mode == 0) ?
					"</font><font color=\"#%02X%02X%02X\" style=\"background-color: #%02X%02X%02X\">"
					: "[/COLOR][COLOR=\"#%02X%02X%02X\"]";
	const char *close_color_str = "</font>";

	char *mbbuf;
	ang_file *fp;

	mbbuf = mem_alloc(text_wcsz() + 1);
	fp = file_open(path, MODE_WRITE, FTYPE_TEXT);

	/* Oops */
	if (!fp) {
		mem_free(mbbuf);
		plog_fmt("Cannot write the '%s' file!", path);
		return;
	}

	/* Retrieve current screen size */
	Term_get_size(&main_wid, &main_hgt);
	if (other_term) {
		Term_activate(other_term);
		Term_get_size(&other_wid, &other_hgt);
		Term_activate(main_term);
	} else {
		other_wid = 0;
		other_hgt = 0;
	}
	if (other_left) {
		other_xst = 0;
		main_xst = (other_wid > 0) ? other_wid + 1 : 0;
	} else {
		other_xst = main_wid + 1;
		main_xst = 0;
	}
	hgt = MAX(main_hgt, other_hgt);
	wid = (other_wid > 0) ? main_wid + other_wid + 1 : main_wid;

	if (mode == 0) {
		file_putf(fp, "<!DOCTYPE html><html><head>\n");
		file_putf(fp, "  <meta http-equiv='Content-Type' content='text/html; charset=utf-8'>\n");
		file_putf(fp, "  <meta name='generator' content='%s'>\n", buildid);
		file_putf(fp, "  <title>%s</title>\n", path);
		file_putf(fp, "</head>\n\n");
		file_putf(fp, "<body style='color: #%02X%02X%02X; background: #%02X%02X%02X;'>\n",
			angband_color_table[COLOUR_WHITE][1],
			angband_color_table[COLOUR_WHITE][2],
			angband_color_table[COLOUR_WHITE][3],
			angband_color_table[COLOUR_DARK][1],
			angband_color_table[COLOUR_DARK][2],
			angband_color_table[COLOUR_DARK][3]);
		file_putf(fp, "<pre>\n");
	} else {
		file_putf(fp, "[CODE][TT][BC=\"#%02X%02X%02X\"][COLOR=\"#%02X%02X%02X\"]\n",
			angband_color_table[COLOUR_DARK][1],
			angband_color_table[COLOUR_DARK][2],
			angband_color_table[COLOUR_DARK][3],
			angband_color_table[COLOUR_WHITE][1],
			angband_color_table[COLOUR_WHITE][2],
			angband_color_table[COLOUR_WHITE][3]);
	}

	/* Dump the screen */
	for (y = 0; y < hgt; y++) {
		for (x = 0; x < wid; x++) {
			/* Get the attr/char */
			if (x >= main_xst && x < main_xst + main_wid
					&& y < main_hgt) {
				screenshot_term_query(wid, hgt, x - main_xst, y,
					&a, &c);
			} else if (x >= other_xst && x < other_xst + other_wid
					&& y < other_hgt) {
				if (x == other_xst) {
					Term_activate(other_term);
				}
				Term_what(x - other_xst, y, &a, &c);
				if (x == other_xst + other_wid - 1) {
					Term_activate(main_term);
				}
			} else {
				a = COLOUR_WHITE;
				c = ' ';
			}

			/* Set the foreground and background */
			fg_colour = a % MAX_COLORS;
			switch (a / MULT_BG)
			{
				case BG_BLACK:
					bg_colour = COLOUR_DARK;
					break;
				case BG_SAME:
					bg_colour = fg_colour;
					break;
				case BG_DARK:
					bg_colour = COLOUR_SHADE;
					break;
				default:
					assert((a >= 0)
						&& (a < BG_MAX * MULT_BG));
			}

			/*
			 * Color change (for forum text, ignore changes if the character is
			 * a space since the forum software strips [COLOR][/COLOR] elements that
			 * only contain whitespace)
			 */
			if (oa != a && (mode == 0 || c != L' ')) {
				if (oa == COLOUR_WHITE && mode == 0) {
					/* From the default white to another color */
					file_putf(fp, new_color_fmt,
							  angband_color_table[fg_colour][1],
							  angband_color_table[fg_colour][2],
							  angband_color_table[fg_colour][3],
							  angband_color_table[bg_colour][1],
							  angband_color_table[bg_colour][2],
							  angband_color_table[bg_colour][3]);
				} else if (fg_colour == COLOUR_WHITE
						&& bg_colour == COLOUR_DARK
						&& mode == 0) {
					/* From another color to the default white */
					file_putf(fp, "%s", close_color_str);
				} else {
					/* Change colors */
					file_putf(fp, change_color_fmt,
							  angband_color_table[fg_colour][1],
							  angband_color_table[fg_colour][2],
							  angband_color_table[fg_colour][3],
							  angband_color_table[bg_colour][1],
							  angband_color_table[bg_colour][2],
							  angband_color_table[bg_colour][3]);
				}

				/* Remember the last color */
				oa = a;
			}

			/* Write the character and escape special HTML characters */
			if (mode == 0) write_html_escape_char(fp, mbbuf, c);
			else {
				int nc = text_wctomb(mbbuf, c);

				if (nc > 0) {
					mbbuf[nc] = 0;
				} else {
					mbbuf[0] = ' ';
					mbbuf[1] = 0;
				}
				file_putf(fp, "%s", mbbuf);
			}
		}

		/* End the row */
		file_putf(fp, "\n");
	}

	/* Close the last font-color tag if necessary */
	if (oa != COLOUR_WHITE && mode == 0) file_putf(fp, "%s", close_color_str);

	if (mode == 0) {
		file_putf(fp, "</pre>\n");
		file_putf(fp, "</body>\n");
		file_putf(fp, "</html>\n");
	} else {
		file_putf(fp, "[/COLOR][/BC][/TT][/CODE]\n");
	}

	/* Close it */
	file_close(fp);

	mem_free(mbbuf);
}